

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O3

aom_codec_err_t ctrl_copy_new_frame_image(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  aom_codec_err_t aVar4;
  long *plVar5;
  YV12_BUFFER_CONFIG new_frame;
  anon_union_8_2_2fc10223_for_yv12_buffer_config_0 local_1b8;
  int local_1b0;
  uint local_1ac;
  int local_1a8;
  uint local_1a4;
  int local_1a0;
  uint local_19c;
  int local_198;
  int local_194;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  int local_138;
  int local_128;
  int local_124;
  undefined8 local_11c;
  undefined4 local_114;
  undefined1 local_110;
  undefined8 local_10c;
  undefined8 local_104;
  undefined4 local_f8;
  undefined8 local_f0;
  YV12_BUFFER_CONFIG local_e8;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    plVar5 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    plVar5 = (long *)args->overflow_arg_area;
    args->overflow_arg_area = plVar5 + 1;
  }
  lVar2 = *plVar5;
  if (lVar2 == 0) {
    aVar4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    iVar3 = av1_get_last_show_frame(ctx->ppi->cpi,&local_e8);
    aVar4 = AOM_CODEC_ERROR;
    if (iVar3 == 0) {
      local_190 = *(ulong *)(lVar2 + 0x40);
      local_188 = *(ulong *)(lVar2 + 0x48);
      local_180 = *(ulong *)(lVar2 + 0x50);
      local_1a8 = *(int *)(lVar2 + 0x28);
      local_1a0 = *(int *)(lVar2 + 0x2c);
      local_104 = *(undefined8 *)(lVar2 + 0x30);
      local_1b8.field_0.y_width = *(int *)(lVar2 + 0x1c);
      local_1b0 = *(int *)(lVar2 + 0x20);
      local_128 = *(int *)(lVar2 + 0x38);
      local_1b8.field_0.uv_width =
           (uint)(local_128 + local_1b8.field_0.y_width) >> ((byte)local_128 & 0x1f);
      local_124 = *(int *)(lVar2 + 0x3c);
      local_1ac = (uint)(local_1b0 + local_124) >> ((byte)local_124 & 0x1f);
      local_1a4 = (uint)(local_1a8 + local_128) >> ((byte)local_128 & 0x1f);
      local_19c = (uint)(local_1a0 + local_124) >> ((byte)local_124 & 0x1f);
      local_198 = *(int *)(lVar2 + 0x58);
      local_194 = *(int *)(lVar2 + 0x5c);
      local_11c = *(undefined8 *)(lVar2 + 4);
      local_114 = *(undefined4 *)(lVar2 + 0xc);
      local_110 = *(undefined1 *)(lVar2 + 0x10);
      local_10c = *(undefined8 *)(lVar2 + 0x14);
      if ((*(byte *)(lVar2 + 1) & 8) == 0) {
        local_f8 = 0;
      }
      else {
        local_190 = local_190 >> 1;
        local_188 = local_188 >> 1;
        local_180 = local_180 >> 1;
        local_198 = local_198 >> 1;
        local_194 = local_194 >> 1;
        local_f8 = 8;
      }
      iVar3 = local_198 - (local_1b8.field_0.y_width + 0x1fU & 0xffffffe0);
      local_138 = 0;
      if (0 < iVar3 / 2) {
        local_138 = iVar3 / 2;
      }
      local_f0 = *(undefined8 *)(lVar2 + 0x98);
      aVar4 = av1_copy_new_frame_enc
                        (&ctx->ppi->cpi->common,&local_e8,(YV12_BUFFER_CONFIG *)&local_1b8.field_0);
    }
  }
  return aVar4;
}

Assistant:

static aom_codec_err_t ctrl_copy_new_frame_image(aom_codec_alg_priv_t *ctx,
                                                 va_list args) {
  aom_image_t *const new_img = va_arg(args, aom_image_t *);

  if (new_img != NULL) {
    YV12_BUFFER_CONFIG new_frame;

    if (av1_get_last_show_frame(ctx->ppi->cpi, &new_frame) == 0) {
      YV12_BUFFER_CONFIG sd;
      image2yuvconfig(new_img, &sd);
      return av1_copy_new_frame_enc(&ctx->ppi->cpi->common, &new_frame, &sd);
    } else {
      return AOM_CODEC_ERROR;
    }
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}